

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::DataBarExpandedReader::decodePattern
          (DataBarExpandedReader *this,int rowNumber,PatternView *view,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  bool bVar1;
  byte bVar2;
  pointer pDVar3;
  ulong uVar4;
  DecoderResult *bits;
  DecoderResult *this_00;
  Barcode *in_RDI;
  string txt;
  Pairs pairs;
  PairMap *allPairs;
  Content *in_stack_fffffffffffffd18;
  DecoderResult *in_stack_fffffffffffffd20;
  Content *in_stack_fffffffffffffd28;
  DetectorResult *in_stack_fffffffffffffd30;
  SymbologyIdentifier si;
  Pair *in_stack_fffffffffffffd48;
  Pair *in_stack_fffffffffffffd50;
  Pairs *in_stack_fffffffffffffd58;
  Result *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  PairMap *all;
  PairMap *in_stack_fffffffffffffdc8;
  BarcodeFormat format;
  DetectorResult *detectorResult;
  DecoderResult *in_stack_fffffffffffffde8;
  Result *in_stack_fffffffffffffdf0;
  int local_1d8;
  undefined1 local_1d4;
  undefined1 uStack_1d3;
  undefined1 uStack_1d2;
  undefined1 uStack_1d1;
  int in_stack_ffffffffffffff14;
  PatternView *in_stack_ffffffffffffff18;
  string local_98 [36];
  undefined4 local_74;
  DetectorResult local_70;
  PairMap *local_30;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                      *)0x2952de);
  if (!bVar1) {
    operator_new(0x38);
    DBERState::DBERState((DBERState *)in_stack_fffffffffffffd20);
    std::
    unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ::reset((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             *)in_stack_fffffffffffffd20,(pointer)in_stack_fffffffffffffd18);
  }
  pDVar3 = std::
           unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
           ::get((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                  *)in_stack_fffffffffffffd20);
  all = (PairMap *)(pDVar3 + 1);
  local_30 = all;
  ReadRowOfPairs<true>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
  bVar1 = Insert(all,(Pairs *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  bVar2 = bVar1 ^ 0xff;
  std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::~vector
            ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *)
             in_stack_fffffffffffffd30);
  if ((bVar2 & 1) == 0) {
    FindValidSequence(in_stack_fffffffffffffdc8);
    bVar1 = std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
            empty((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *
                  )in_stack_fffffffffffffd30);
    if (bVar1) {
      in_RDI->_format = None;
      in_RDI->_ecLevel[0] = '\0';
      in_RDI->_ecLevel[1] = '\0';
      in_RDI->_ecLevel[2] = '\0';
      in_RDI->_ecLevel[3] = '\0';
      in_RDI->_version[0] = '\0';
      in_RDI->_version[1] = '\0';
      in_RDI->_version[2] = '\0';
      in_RDI->_version[3] = '\0';
      in_RDI->_lineCount = 0;
      (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
      *(undefined8 *)&(in_RDI->_sai).id = 0;
      (in_RDI->_sai).id._M_string_length = 0;
      *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
      (in_RDI->_sai).index = 0;
      (in_RDI->_sai).count = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
      *(undefined8 *)&in_RDI->_readerOpts = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
      (in_RDI->_error)._line = 0;
      (in_RDI->_error)._type = None;
      *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
      (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
      *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
      (in_RDI->_error)._file = (char *)0x0;
      (in_RDI->_error)._msg._M_string_length = 0;
      (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
      (in_RDI->_content).symbology.code = '\0';
      (in_RDI->_content).symbology.modifier = '\0';
      (in_RDI->_content).symbology.eciModifierOffset = '\0';
      (in_RDI->_content).symbology.aiFlag = None;
      (in_RDI->_content).defaultCharset = Unknown;
      (in_RDI->_content).hasECI = false;
      *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
      *(undefined8 *)&(in_RDI->_error)._msg = 0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (in_RDI->_content).encodings.
      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RDI->_isMirrored = false;
      in_RDI->_isInverted = false;
      in_RDI->_readerInit = false;
      *(undefined5 *)&in_RDI->field_0xd3 = 0;
      Result::Result((Result *)0x0);
      local_74 = 1;
    }
    else {
      BuildBitArray(in_stack_fffffffffffffd58);
      DataBar::DecodeExpandedBits_abi_cxx11_((BitArray *)in_stack_fffffffffffffd48);
      BitArray::~BitArray((BitArray *)0x2954d1);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        RemovePairs((PairMap *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        si = SUB84((ulong)in_stack_fffffffffffffd30 >> 0x20,0);
        ByteArray::ByteArray
                  ((ByteArray *)in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
        local_1d4 = 0x65;
        uStack_1d3 = 0x30;
        uStack_1d2 = 0;
        uStack_1d1 = 1;
        Content::Content(in_stack_fffffffffffffd28,(ByteArray *)in_stack_fffffffffffffd20,si);
        DecoderResult::DecoderResult(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd30 = &local_70;
        std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::front
                  ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    *)in_stack_fffffffffffffd20);
        std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::back
                  ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    *)in_stack_fffffffffffffd20);
        local_1d8 = DataBar::EstimateLineCount
                              ((Pair *)in_stack_fffffffffffffd20,(Pair *)in_stack_fffffffffffffd18);
        bits = DecoderResult::setLineCount((DecoderResult *)&stack0xfffffffffffffe80,&local_1d8);
        format = None;
        detectorResult = (DetectorResult *)0x0;
        BitMatrix::BitMatrix((BitMatrix *)0x295698);
        this_00 = (DecoderResult *)
                  std::
                  vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
                  front((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                         *)in_stack_fffffffffffffd20);
        std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::back
                  ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    *)this_00);
        DataBar::EstimatePosition(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        DetectorResult::DetectorResult
                  (in_stack_fffffffffffffd30,(BitMatrix *)bits,(QuadrilateralI *)this_00);
        Result::Result(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,detectorResult,format);
        DetectorResult::~DetectorResult((DetectorResult *)0x29571b);
        BitMatrix::~BitMatrix((BitMatrix *)0x295728);
        DecoderResult::~DecoderResult(this_00);
        Content::~Content(&this_00->_content);
        ByteArray::~ByteArray((ByteArray *)0x29574f);
      }
      else {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result(in_stack_fffffffffffffd60);
      }
      local_74 = 1;
      std::__cxx11::string::~string(local_98);
    }
    std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::~vector
              ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *)
               in_stack_fffffffffffffd30);
  }
  else {
    memset(in_RDI,0,0xd8);
    Result::Result(in_stack_fffffffffffffd60);
  }
  return in_RDI;
}

Assistant:

Barcode DataBarExpandedReader::decodePattern(int rowNumber, PatternView& view, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	auto pairs = ReadRowOfPairs<false>(view, rowNumber);

	if (pairs.empty() || !ChecksumIsValid(pairs))
		return {};
#else
	if (!state)
		state.reset(new DBERState);
	auto& allPairs = static_cast<DBERState*>(state.get())->allPairs;

	// Stacked codes can be laid out in a number of ways. The following rules apply:
	//  * the first row starts with FINDER_A in left-to-right (l2r) layout
	//  * pairs in l2r layout start with a space, r2l ones with a bar
	//  * l2r and r2l finders always alternate
	//  * rows may contain any number of pairs
	//  * even rows may be reversed
	//  * a l2r pair that starts with a bar is actually a r2l pair on a reversed line
	//  * the last pair of the symbol may be missing the right character
	//
	// 3 examples: (r == l2r, l == r2l, R/L == r/l but reversed)
	//    r l r l    |    r l     |     r l r
	//    L R L R    |    r       |     l

	if (!Insert(allPairs, ReadRowOfPairs<true>(view, rowNumber)))
		return {};

	auto pairs = FindValidSequence(allPairs);
	if (pairs.empty())
		return {};
#endif

	auto txt = DecodeExpandedBits(BuildBitArray(pairs));
	if (txt.empty())
		return {};

	RemovePairs(allPairs, pairs);

	// TODO: EstimatePosition misses part of the symbol in the stacked case where the last row contains less pairs than
	// the first
	// Symbology identifier: ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
	return {DecoderResult(Content(ByteArray(txt), {'e', '0', 0, AIFlag::GS1}))
				.setLineCount(EstimateLineCount(pairs.front(), pairs.back())),
			{{}, EstimatePosition(pairs.front(), pairs.back())}, BarcodeFormat::DataBarExpanded};
}